

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body.cc
# Opt level: O1

void __thiscall
apollonia::PolygonBody::PolygonBody(PolygonBody *this,Float mass,VertexList *vertices)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pVVar4;
  pointer pVVar5;
  Vec2 VVar6;
  Mat22 *pMVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  (this->super_Body)._vptr_Body = (_func_int **)&PTR__Body_0014acf0;
  (this->super_Body).centroid_.x = 0.0;
  (this->super_Body).centroid_.y = 0.0;
  (this->super_Body).position_.x = 0.0;
  (this->super_Body).position_.y = 0.0;
  (this->super_Body).rotation_.mat_._M_elems[0].x = 1.0;
  (this->super_Body).rotation_.mat_._M_elems[0].y = 0.0;
  pMVar7 = &(this->super_Body).rotation_;
  (pMVar7->mat_)._M_elems[1].x = 0.0;
  (pMVar7->mat_)._M_elems[1].y = 1.0;
  (this->super_Body).velocity_.x = 0.0;
  (this->super_Body).velocity_.y = 0.0;
  (this->super_Body).angular_velocity_ = 0.0;
  (this->super_Body).force_.x = 0.0;
  *(undefined8 *)&(this->super_Body).force_.y = 0;
  (this->super_Body).friction_ = 1.0;
  (this->super_Body).bounce_ = 0.0;
  (this->super_Body).mass_ = mass;
  (this->super_Body).inv_mass_ = 1.0 / mass;
  (this->super_Body)._vptr_Body = (_func_int **)&PTR__PolygonBody_0014acd0;
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::vector(&this->vertices_,vertices);
  pVVar4 = (vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pVVar5 = (vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  lVar8 = (long)pVVar5 - (long)pVVar4 >> 3;
  if (pVVar5 == pVVar4) {
    fVar11 = ((mass * 0.0) / 6.0) / 0.0;
    (this->super_Body).inertia_ = fVar11;
    (this->super_Body).inv_inertia_ = 1.0 / fVar11;
  }
  else {
    fVar11 = 0.0;
    lVar9 = 1;
    fVar12 = 0.0;
    do {
      fVar13 = pVVar4[lVar9 + -1].x;
      lVar10 = 0;
      if (lVar8 != lVar9) {
        lVar10 = lVar9;
      }
      fVar1 = pVVar4[lVar9 + -1].y;
      fVar2 = pVVar4[lVar10].x;
      fVar3 = pVVar4[lVar10].y;
      fVar14 = ABS(fVar13 * fVar3 - fVar2 * fVar1);
      fVar11 = fVar11 + (fVar13 * fVar2 + fVar1 * fVar3 +
                        fVar2 * fVar2 + fVar3 * fVar3 + fVar13 * fVar13 + fVar1 * fVar1) * fVar14;
      fVar12 = fVar12 + fVar14;
      lVar10 = (-(ulong)(lVar8 == 0) - lVar8) + lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar10 != 0);
    fVar12 = ((fVar11 * mass) / 6.0) / fVar12;
    (this->super_Body).inertia_ = fVar12;
    (this->super_Body).inv_inertia_ = 1.0 / fVar12;
    if (pVVar5 != pVVar4) {
      fVar11 = 0.0;
      fVar12 = 0.0;
      lVar9 = 1;
      do {
        lVar10 = 0;
        if (lVar8 != lVar9) {
          lVar10 = lVar9;
        }
        fVar13 = pVVar4[lVar9 + -1].x * pVVar4[lVar10].y - pVVar4[lVar10].x * pVVar4[lVar9 + -1].y;
        fVar11 = (pVVar4[lVar9 + -1].x + pVVar4[lVar10].x) * fVar13 + fVar11;
        fVar12 = fVar12 + fVar13 * (pVVar4[lVar9 + -1].y + pVVar4[lVar10].y);
        lVar10 = (-(ulong)(lVar8 == 0) - lVar8) + lVar9;
        lVar9 = lVar9 + 1;
      } while (lVar10 != 0);
      goto LAB_001102c1;
    }
  }
  fVar11 = 0.0;
  fVar12 = 0.0;
LAB_001102c1:
  if (pVVar5 == pVVar4) {
    fVar13 = 0.0;
  }
  else {
    fVar13 = 0.0;
    lVar9 = 1;
    do {
      lVar10 = 0;
      if (lVar8 != lVar9) {
        lVar10 = lVar9;
      }
      fVar13 = fVar13 + (pVVar4[lVar9 + -1].x * pVVar4[lVar10].y -
                        pVVar4[lVar10].x * pVVar4[lVar9 + -1].y);
      lVar10 = (-(ulong)(lVar8 == 0) - lVar8) + lVar9;
      lVar9 = lVar9 + 1;
    } while (lVar10 != 0);
    fVar13 = fVar13 * 0.5;
  }
  VVar6.y = (fVar12 / 6.0) / fVar13;
  VVar6.x = (fVar11 / 6.0) / fVar13;
  (this->super_Body).centroid_ = VVar6;
  return;
}

Assistant:

PolygonBody::PolygonBody(Float mass, const VertexList& vertices)
    : Body(mass), vertices_(vertices) {
  set_inertia(PolygonInertia(mass, vertices));
  set_centroid(PolygonCentroid(vertices));
}